

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O2

CURLcode cf_hc_shutdown(Curl_cfilter *cf,Curl_easy *data,_Bool *done)

{
  CURLcode CVar1;
  cf_hc_baller *b;
  curl_trc_feat *pcVar2;
  bool bVar3;
  _Bool _Var4;
  CURLcode CVar5;
  long lVar6;
  _Bool bdone;
  cf_hc_baller *ballers [2];
  _Bool local_49;
  long local_48 [3];
  
  if ((cf->field_0x24 & 1) == 0) {
    local_48[0] = (long)cf->ctx + 0x28;
    local_48[1] = (long)cf->ctx + 0x58;
    for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
      b = (cf_hc_baller *)local_48[lVar6];
      local_49 = false;
      _Var4 = cf_hc_baller_is_active(b);
      if ((_Var4) && ((b->field_0x2c & 2) == 0)) {
        CVar5 = (*b->cf->cft->do_shutdown)(b->cf,data,&local_49);
        b->result = CVar5;
        if ((CVar5 != CURLE_OK) || (local_49 == true)) {
          b->field_0x2c = b->field_0x2c | 2;
        }
      }
    }
    *done = true;
    bVar3 = true;
    for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
      if ((local_48[lVar6] != 0) && ((*(byte *)(local_48[lVar6] + 0x2c) & 2) == 0)) {
        *done = false;
        bVar3 = false;
      }
    }
    CVar5 = CURLE_OK;
    if (bVar3) {
      CVar5 = CURLE_OK;
      for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
        if ((local_48[lVar6] != 0) &&
           (CVar1 = *(CURLcode *)(local_48[lVar6] + 0x10), CVar1 != CURLE_OK)) {
          CVar5 = CVar1;
        }
      }
    }
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
      pcVar2 = (data->state).feat;
      if (pcVar2 == (curl_trc_feat *)0x0) {
        if (cf == (Curl_cfilter *)0x0) {
          return CVar5;
        }
      }
      else {
        if (cf == (Curl_cfilter *)0x0) {
          return CVar5;
        }
        if (pcVar2->log_level < 1) {
          return CVar5;
        }
      }
      if (0 < cf->cft->log_level) {
        Curl_trc_cf_infof(data,cf,"shutdown -> %d, done=%d",(ulong)CVar5,(ulong)bVar3);
      }
    }
  }
  else {
    *done = true;
    CVar5 = CURLE_OK;
  }
  return CVar5;
}

Assistant:

static CURLcode cf_hc_shutdown(struct Curl_cfilter *cf,
                               struct Curl_easy *data, bool *done)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  struct cf_hc_baller *ballers[2];
  size_t i;
  CURLcode result = CURLE_OK;

  DEBUGASSERT(data);
  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  /* shutdown all ballers that have not done so already. If one fails,
   * continue shutting down others until all are shutdown. */
  ballers[0] = &ctx->h3_baller;
  ballers[1] = &ctx->h21_baller;
  for(i = 0; i < sizeof(ballers)/sizeof(ballers[0]); i++) {
    struct cf_hc_baller *b = ballers[i];
    bool bdone = FALSE;
    if(!cf_hc_baller_is_active(b) || b->shutdown)
      continue;
    b->result = b->cf->cft->do_shutdown(b->cf, data, &bdone);
    if(b->result || bdone)
      b->shutdown = TRUE; /* treat a failed shutdown as done */
  }

  *done = TRUE;
  for(i = 0; i < sizeof(ballers)/sizeof(ballers[0]); i++) {
    if(ballers[i] && !ballers[i]->shutdown)
      *done = FALSE;
  }
  if(*done) {
    for(i = 0; i < sizeof(ballers)/sizeof(ballers[0]); i++) {
      if(ballers[i] && ballers[i]->result)
        result = ballers[i]->result;
    }
  }
  CURL_TRC_CF(data, cf, "shutdown -> %d, done=%d", result, *done);
  return result;
}